

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O2

void __thiscall QImage::applyColorTransform(QImage *this,QColorTransform *transform)

{
  Format f;
  uint uVar1;
  QColorSpacePrivate *pQVar2;
  bool bVar3;
  char cVar4;
  QRgb QVar5;
  int iVar6;
  pointer puVar7;
  undefined8 *puVar8;
  QThreadPool *pQVar9;
  undefined8 *puVar10;
  Format FVar11;
  QImageData *pQVar12;
  int iVar13;
  int i;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  undefined4 local_5c;
  _Any_data local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  code *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QColorTransform::isIdentity(transform);
  if (bVar3) goto LAB_00270b5d;
  if (this->d == (QImageData *)0x0) {
    uVar15 = 0;
  }
  else {
    uVar15 = (ulong)this->d->format;
  }
  bVar3 = qt_compatibleColorModelSource
                    ((ColorModel)pixelformats[uVar15].data & (Alpha|YUV),
                     ((((transform->d).d.ptr)->colorSpaceIn).d.ptr)->colorModel);
  if (bVar3) {
    if (this->d == (QImageData *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = (ulong)this->d->format;
    }
    pQVar2 = (((transform->d).d.ptr)->colorSpaceOut).d.ptr;
    bVar3 = qt_compatibleColorModelTarget
                      ((ColorModel)pixelformats[uVar15].data & (Alpha|YUV),pQVar2->colorModel,
                       pQVar2->transformModel);
    if (bVar3) {
      detach(this);
      pQVar12 = this->d;
      if (pQVar12 == (QImageData *)0x0) goto LAB_00270b5d;
      f = pQVar12->format;
      if ((pixelformats[f].data & 0xf) == 2) {
        for (uVar15 = 0; uVar15 < (ulong)(pQVar12->colortable).d.size; uVar15 = uVar15 + 1) {
          puVar7 = QList<unsigned_int>::data(&pQVar12->colortable);
          QVar5 = QColorTransform::map(transform,puVar7[uVar15]);
          puVar7 = QList<unsigned_int>::data(&this->d->colortable);
          puVar7[uVar15] = QVar5;
          pQVar12 = this->d;
        }
        goto LAB_00270b5d;
      }
      if (f - Format_RGBX16FPx4 < 6) {
        if (f < Format_RGBX32FPx4) {
          FVar11 = Format_RGBA32FPx4;
          goto LAB_002707cb;
        }
      }
      else if (pQVar12->depth < 0x21) {
        if ((Format_CMYK8888 < f) || ((0x1011000070U >> ((ulong)f & 0x3f) & 1) == 0)) {
          bVar3 = hasAlphaChannel(this);
          FVar11 = bVar3 | Format_RGB32;
          goto LAB_002707cb;
        }
      }
      else if (f - Format_Grayscale16 < 0xfffffffd) {
        FVar11 = Format_RGBA64;
LAB_002707cb:
        convertTo(this,FVar11,(ImageConversionFlags)0x0);
      }
      local_5c = 0;
      pQVar12 = this->d;
      FVar11 = pQVar12->format;
      if ((0x1213000010U >> ((ulong)FVar11 & 0x3f) & 1) == 0) {
        if ((0x404000020U >> ((ulong)FVar11 & 0x3f) & 1) == 0) {
          local_5c = 6;
        }
      }
      else {
        local_5c = 1;
      }
      local_48 = 0;
      uStack_44 = 0;
      pcStack_40 = (code *)0x0;
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      if (FVar11 == Format_Grayscale16) {
        puVar8 = (undefined8 *)operator_new(0x18);
        *puVar8 = this;
        puVar8[1] = transform;
        local_58._0_4_ = SUB84(puVar8,0);
        local_58._4_4_ = (undefined4)((ulong)puVar8 >> 0x20);
        puVar8[2] = &local_5c;
        pcStack_40 = std::
                     _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5304:28)>
                     ::_M_invoke;
        local_48 = 0x272ede;
      }
      else if (FVar11 == Format_Grayscale8) {
        puVar8 = (undefined8 *)operator_new(0x18);
        *puVar8 = this;
        puVar8[1] = transform;
        local_58._0_4_ = SUB84(puVar8,0);
        local_58._4_4_ = (undefined4)((ulong)puVar8 >> 0x20);
        puVar8[2] = &local_5c;
        pcStack_40 = std::
                     _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5297:28)>
                     ::_M_invoke;
        local_48 = 0x272e1e;
      }
      else if (FVar11 - Format_RGBX16FPx4 < 6) {
        puVar8 = (undefined8 *)operator_new(0x18);
        *puVar8 = this;
        puVar8[1] = transform;
        local_58._0_4_ = SUB84(puVar8,0);
        local_58._4_4_ = (undefined4)((ulong)puVar8 >> 0x20);
        puVar8[2] = &local_5c;
        pcStack_40 = std::
                     _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5311:28)>
                     ::_M_invoke;
        local_48 = 0x272f9e;
      }
      else if (pQVar12->depth < 0x21) {
        puVar8 = (undefined8 *)operator_new(0x18);
        *puVar8 = this;
        puVar8[1] = transform;
        puVar8[2] = &local_5c;
        local_58._0_4_ = SUB84(puVar8,0);
        local_58._4_4_ = (undefined4)((ulong)puVar8 >> 0x20);
        local_48 = 0x2731de;
        if (f == Format_CMYK8888) {
          local_48 = 0x27311e;
        }
        pcStack_40 = std::
                     _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5332:28)>
                     ::_M_invoke;
        if (f == Format_CMYK8888) {
          pcStack_40 = std::
                       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5325:28)>
                       ::_M_invoke;
        }
      }
      else {
        puVar8 = (undefined8 *)operator_new(0x18);
        *puVar8 = this;
        puVar8[1] = transform;
        local_58._0_4_ = SUB84(puVar8,0);
        local_58._4_4_ = (undefined4)((ulong)puVar8 >> 0x20);
        puVar8[2] = &local_5c;
        pcStack_40 = std::
                     _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5318:28)>
                     ::_M_invoke;
        local_48 = 0x27305e;
      }
      local_58._12_4_ = 0;
      local_58._8_4_ = 0;
      uStack_44 = 0;
      uVar1 = pQVar12->height;
      uVar16 = (long)pQVar12->width * (long)(int)uVar1;
      uVar15 = uVar16 >> 0x10 & 0xffffffff;
      if ((int)uVar1 < (int)(uVar16 >> 0x10)) {
        uVar15 = (ulong)uVar1;
      }
      pQVar9 = QGuiApplicationPrivate::qtGuiThreadPool();
      if (pQVar9 == (QThreadPool *)0x0 || (int)uVar15 < 2) {
LAB_00270a15:
        if (this->d == (QImageData *)0x0) {
          iVar14 = 0;
        }
        else {
          iVar14 = this->d->height;
        }
        std::function<void_(int,_int)>::operator()((function<void_(int,_int)> *)&local_58,0,iVar14);
      }
      else {
        QThread::currentThread();
        cVar4 = QThreadPool::contains((QThread *)pQVar9);
        if (cVar4 != '\0') goto LAB_00270a15;
        _semaphore = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
        iVar14 = 0;
        QSemaphore::QSemaphore(&semaphore,0);
        while( true ) {
          iVar13 = (int)uVar15;
          uVar15 = (ulong)(iVar13 - 1);
          if (iVar13 == 0) break;
          if (this->d == (QImageData *)0x0) {
            iVar6 = 0;
          }
          else {
            iVar6 = this->d->height;
          }
          iVar13 = (iVar6 - iVar14) / iVar13;
          puVar8 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar8 + 1) = 1;
          *puVar8 = QFactoryLoader::keyMap;
          puVar10 = (undefined8 *)operator_new(0x20);
          *puVar10 = QRunnable::QGenericRunnable::
                     Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5349:31)>
                     ::impl;
          *(int *)(puVar10 + 1) = iVar14;
          *(int *)((long)puVar10 + 0xc) = iVar13;
          puVar10[2] = &local_58;
          puVar10[3] = &semaphore;
          puVar8[2] = puVar10;
          QThreadPool::start((QRunnable *)pQVar9,(int)puVar8);
          iVar14 = iVar14 + iVar13;
        }
        QSemaphore::acquire((int)&semaphore);
        QSemaphore::~QSemaphore(&semaphore);
      }
      if (this->d == (QImageData *)0x0) {
        FVar11 = Format_Invalid;
      }
      else {
        FVar11 = this->d->format;
      }
      if (f != FVar11) {
        convertToFormat((QImage *)&semaphore,this,f,(ImageConversionFlags)0x0);
        operator=(this,(QImage *)&semaphore);
        ~QImage((QImage *)&semaphore);
      }
      if ((code *)CONCAT44(uStack_44,local_48) != (code *)0x0) {
        (*(code *)CONCAT44(uStack_44,local_48))(&local_58,&local_58,3);
      }
      goto LAB_00270b5d;
    }
  }
  local_58._0_4_ = 2;
  uStack_44 = 0;
  local_58._4_4_ = 0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_48 = 0;
  pcStack_40 = (code *)0x5efe3e;
  QMessageLogger::warning();
  QDebug::operator<<((QDebug *)&semaphore,
                     "QImage::applyColorTransform can not apply format switching transform without switching format"
                    );
  QDebug::~QDebug((QDebug *)&semaphore);
LAB_00270b5d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QImage::applyColorTransform(const QColorTransform &transform)
{
    if (transform.isIdentity())
        return;

    if (!qt_compatibleColorModelSource(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceIn->colorModel) ||
        !qt_compatibleColorModelTarget(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceOut->colorModel,
                                       QColorTransformPrivate::get(transform)->colorSpaceOut->transformModel)) {
        qWarning() << "QImage::applyColorTransform can not apply format switching transform without switching format";
        return;
    }

    detach();
    if (!d)
        return;
    if (pixelFormat().colorModel() == QPixelFormat::Indexed) {
        for (int i = 0; i < d->colortable.size(); ++i)
            d->colortable[i] = transform.map(d->colortable[i]);
        return;
    }
    QImage::Format oldFormat = format();
    if (qt_fpColorPrecision(oldFormat)) {
        if (oldFormat != QImage::Format_RGBX32FPx4 && oldFormat != QImage::Format_RGBA32FPx4
                && oldFormat != QImage::Format_RGBA32FPx4_Premultiplied)
            convertTo(QImage::Format_RGBA32FPx4);
    } else if (depth() > 32) {
        if (oldFormat != QImage::Format_RGBX64 && oldFormat != QImage::Format_RGBA64
                && oldFormat != QImage::Format_RGBA64_Premultiplied)
            convertTo(QImage::Format_RGBA64);
    } else if (oldFormat != QImage::Format_ARGB32 && oldFormat != QImage::Format_RGB32
                && oldFormat != QImage::Format_ARGB32_Premultiplied && oldFormat != QImage::Format_CMYK8888
                && oldFormat != QImage::Format_Grayscale8 && oldFormat != QImage::Format_Grayscale16) {
        if (hasAlphaChannel())
            convertTo(QImage::Format_ARGB32);
        else
            convertTo(QImage::Format_RGB32);
    }

    QColorTransformPrivate::TransformFlags flags = QColorTransformPrivate::Unpremultiplied;
    switch (format()) {
    case Format_ARGB32_Premultiplied:
    case Format_RGBA64_Premultiplied:
    case Format_RGBA32FPx4_Premultiplied:
        flags = QColorTransformPrivate::Premultiplied;
        break;
    case Format_Grayscale8:
    case Format_Grayscale16:
    case Format_RGB32:
    case Format_CMYK8888:
    case Format_RGBX64:
    case Format_RGBX32FPx4:
        flags = QColorTransformPrivate::InputOpaque;
        break;
    case Format_ARGB32:
    case Format_RGBA64:
    case Format_RGBA32FPx4:
        break;
    default:
        Q_UNREACHABLE();
    }

    std::function<void(int,int)> transformSegment;

    if (format() == Format_Grayscale8) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint8_t *scanline = reinterpret_cast<uint8_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (format() == Format_Grayscale16) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint16_t *scanline = reinterpret_cast<uint16_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (qt_fpColorPrecision(format())) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgbaFloat32 *scanline = reinterpret_cast<QRgbaFloat32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else  if (depth() > 32) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgba64 *scanline = reinterpret_cast<QRgba64 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (oldFormat == QImage::Format_CMYK8888) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QCmyk32 *scanline = reinterpret_cast<QCmyk32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgb *scanline = reinterpret_cast<QRgb *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    }

#if QT_CONFIG(qtgui_threadpool)
    int segments = (qsizetype(width()) * height()) >> 16;
    segments = std::min(segments, height());
    QThreadPool *threadPool = QGuiApplicationPrivate::qtGuiThreadPool();
    if (segments > 1 && threadPool && !threadPool->contains(QThread::currentThread())) {
        QSemaphore semaphore;
        int y = 0;
        for (int i = 0; i < segments; ++i) {
            int yn = (height() - y) / (segments - i);
            threadPool->start([&, y, yn]() {
                transformSegment(y, y + yn);
                semaphore.release(1);
            });
            y += yn;
        }
        semaphore.acquire(segments);
    } else
#endif
        transformSegment(0, height());

    if (oldFormat != format())
        *this = std::move(*this).convertToFormat(oldFormat);
}